

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O1

bool __thiscall
ONX_ModelTest::DumpReadWriteReadModel(ONX_ModelTest *this,wchar_t *text_file_full_path)

{
  bool bVar1;
  uint uVar2;
  FILE *pFile;
  shared_ptr<ONX_Model> model;
  ON_TextLog text_log;
  undefined1 local_a0 [136];
  
  if ((text_file_full_path != (wchar_t *)0x0) && (*text_file_full_path != L'\0')) {
    pFile = ON_FileStream::Open(text_file_full_path,L"w");
    if (pFile != (FILE *)0x0) {
      ReadWriteReadModel((ONX_ModelTest *)local_a0);
      if (local_a0._0_8_ == 0) {
LAB_0046d2dc:
        bVar1 = false;
      }
      else {
        uVar2 = ON_ComponentManifest::ActiveComponentCount
                          ((ON_ComponentManifest *)(local_a0._0_8_ + 0x8d0),Unset);
        if (uVar2 == 0) goto LAB_0046d2dc;
        ON_TextLog::ON_TextLog((ON_TextLog *)(local_a0 + 0x10),pFile);
        bVar1 = DumpReadWriteReadModel(this,(ON_TextLog *)(local_a0 + 0x10));
        ON_TextLog::~ON_TextLog((ON_TextLog *)(local_a0 + 0x10));
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a0._8_8_);
      }
      goto LAB_0046d2bf;
    }
  }
  bVar1 = false;
  pFile = (FILE *)0x0;
LAB_0046d2bf:
  if (pFile != (FILE *)0x0) {
    ON_FileStream::Close(pFile);
  }
  return bVar1;
}

Assistant:

bool ONX_ModelTest::DumpReadWriteReadModel(const wchar_t* text_file_full_path) const
{
  bool rc = false;
  FILE* fp = nullptr;
  for (;;)
  {
    if (nullptr == text_file_full_path || 0 == text_file_full_path[0])
      break;
    fp = ON_FileStream::Open(text_file_full_path, L"w");
    if (nullptr == fp)
      break;
    const auto model = ReadWriteReadModel();
    if (nullptr == model)
      break;
    if (model->Manifest().ActiveComponentCount(ON_ModelComponent::Type::Unset) <= 0)
      break;
    ON_TextLog text_log(fp);
    rc = DumpReadWriteReadModel(text_log);
    break;
  }

  if (nullptr != fp)
    ON_FileStream::Close(fp);

  return rc;
}